

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsTTDNotifyYield(void)

{
  ScriptContext *local_28;
  ScriptContext *scriptContext;
  JsrtContext *pJStack_18;
  JsErrorCode cCheck;
  JsrtContext *currentContext;
  
  pJStack_18 = JsrtContext::GetCurrent();
  scriptContext._4_4_ = CheckContext(pJStack_18,false,false);
  if (scriptContext._4_4_ == JsNoError) {
    local_28 = JsrtContext::GetScriptContext(pJStack_18);
    currentContext._4_4_ =
         GlobalAPIWrapper_NoRecord<JsTTDNotifyYield::__0>((anon_class_8_1_1b6df084)&local_28);
  }
  else {
    currentContext._4_4_ = JsNoError;
  }
  return currentContext._4_4_;
}

Assistant:

CHAKRA_API JsTTDNotifyYield()
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    JsrtContext *currentContext = JsrtContext::GetCurrent();
    JsErrorCode cCheck = CheckContext(currentContext, JSRT_MAYBE_TRUE);
    if(cCheck != JsNoError)
    {
        return JsNoError; //we are ok just aren't going to do any TTD related work
    }

    Js::ScriptContext* scriptContext = currentContext->GetScriptContext();
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode
    {
        if(scriptContext->IsTTDRecordModeEnabled())
        {
            scriptContext->GetThreadContext()->TTDLog->RecordJsRTEventLoopYieldPoint();
        }

        return JsNoError;
    });
#endif
}